

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis<float,double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  size_t *psVar1;
  bool bVar2;
  long lVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 local_28 [16];
  
  if (missing_action == Fail) {
    dVar13 = 0.0;
    dVar7 = 0.0;
    if (st <= end) {
      dVar20 = 0.0;
      dVar13 = 0.0;
      dVar14 = 0.0;
      lVar3 = 0;
      do {
        lVar5 = lVar3 + 1;
        auVar23._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar23._0_8_ = lVar5;
        auVar23._12_4_ = 0x45300000;
        dVar19 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
        dVar17 = ((double)x[ix_arr[st + lVar3]] - dVar14) / dVar19;
        auVar21._8_4_ = (int)((ulong)lVar3 >> 0x20);
        auVar21._0_8_ = lVar3;
        auVar21._12_4_ = 0x45300000;
        dVar15 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * dVar17 *
                 ((double)x[ix_arr[st + lVar3]] - dVar14);
        dVar7 = dVar7 + dVar17 * -4.0 * dVar20 +
                        dVar17 * dVar17 * 6.0 * dVar13 +
                        (dVar19 * dVar19 + dVar19 * -3.0 + 3.0) * dVar17 * dVar17 * dVar15;
        dVar14 = dVar14 + dVar17;
        dVar20 = dVar20 + dVar17 * -3.0 * dVar13 + (dVar19 + -2.0) * dVar17 * dVar15;
        uVar6 = st + 1 + lVar3;
        dVar13 = dVar15 + dVar13;
        lVar3 = lVar5;
      } while (uVar6 <= end);
    }
    if ((!NAN(dVar13)) &&
       (dVar20 = ABS(dVar13),
       (uint)((long)dVar20 + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)dVar13 < 0 ||
       (dVar20 == 0.0 || (long)dVar20 - 1U < 0xfffffffffffff && (long)dVar13 < 0))) {
      if (end - st < 2) {
        return -INFINITY;
      }
      uVar6 = st + 1;
      do {
        if (end < uVar6) {
          return -INFINITY;
        }
        psVar1 = ix_arr + uVar6;
        uVar6 = uVar6 + 1;
      } while ((x[*psVar1] == x[ix_arr[st]]) && (!NAN(x[*psVar1]) && !NAN(x[ix_arr[st]])));
    }
    lVar3 = (end - st) + 1;
    auVar10._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar10._0_8_ = lVar3;
    auVar10._12_4_ = 0x45300000;
    auVar12._0_8_ =
         (auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    auVar12._8_8_ = dVar7;
    auVar9._8_8_ = dVar13;
    auVar9._0_8_ = dVar13;
    auVar23 = divpd(auVar12,auVar9);
    dVar7 = auVar23._8_8_ * auVar23._0_8_;
  }
  else {
    if (end < st) {
      local_28 = (undefined1  [16])0x0;
      lVar5 = 0;
      dVar20 = 0.0;
    }
    else {
      dVar20 = 0.0;
      dVar7 = 0.0;
      dVar13 = 0.0;
      local_28 = ZEXT816(0);
      sVar4 = st;
      lVar3 = 0;
      do {
        lVar5 = lVar3;
        if ((uint)ABS(x[ix_arr[sVar4]]) < 0x7f800000) {
          lVar5 = lVar3 + 1;
          auVar16._8_4_ = (int)((ulong)lVar5 >> 0x20);
          auVar16._0_8_ = lVar5;
          auVar16._12_4_ = 0x45300000;
          dVar14 = (auVar16._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
          dVar19 = (double)x[ix_arr[sVar4]] - dVar13;
          dVar15 = dVar19 / dVar14;
          auVar18._8_4_ = (int)((ulong)lVar3 >> 0x20);
          auVar18._0_8_ = lVar3;
          auVar18._12_4_ = 0x45300000;
          dVar19 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) * dVar15 * dVar19
          ;
          dVar20 = dVar20 + dVar15 * -4.0 * dVar7 +
                            dVar15 * dVar15 * 6.0 * (double)local_28._0_8_ +
                            (dVar14 * dVar14 + dVar14 * -3.0 + 3.0) * dVar15 * dVar15 * dVar19;
          dVar13 = dVar13 + dVar15;
          dVar7 = dVar7 + dVar15 * -3.0 * (double)local_28._0_8_ + (dVar14 + -2.0) * dVar15 * dVar19
          ;
          local_28._0_8_ = (double)local_28._0_8_ + dVar19;
        }
        sVar4 = sVar4 + 1;
        lVar3 = lVar5;
      } while (sVar4 <= end);
    }
    auVar11._0_8_ = local_28._0_8_;
    if (lVar5 == 0) {
      return -INFINITY;
    }
    if (((!NAN(auVar11._0_8_)) &&
        ((uint)((long)ABS(auVar11._0_8_) + 0xfff0000000000000U >> 0x35) < 0x3ff &&
         (long)auVar11._0_8_ < 0 ||
         ((local_28 & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
         (long)ABS(auVar11._0_8_) - 1U < 0xfffffffffffff && (long)auVar11._0_8_ < 0))) &&
       (bVar2 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action), !bVar2)) {
      return -INFINITY;
    }
    auVar8._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar8._0_8_ = lVar5;
    auVar8._12_4_ = 0x45300000;
    auVar22._8_8_ =
         (auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    auVar22._0_8_ = dVar20;
    auVar11._8_8_ = auVar11._0_8_;
    auVar23 = divpd(auVar22,auVar11);
    dVar7 = auVar23._8_8_ * auVar23._0_8_;
  }
  if (0x7fefffffffffffff < (ulong)ABS(dVar7)) {
    return -INFINITY;
  }
  if (dVar7 <= 0.0) {
    return 0.0;
  }
  return dVar7;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}